

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles2::Stress::(anonymous_namespace)::UniformCase::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = *(int *)((long)this + 0x84);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (iVar1 == 0) {
    pcVar3 = 
    "attribute highp vec4 a_pos;\nuniform highp vec4 u_special;\nvarying mediump vec4 v_out;\nvoid main ()\n{\n\thighp vec2 a1 = u_special.xz + u_special.yw; // add\n\thighp vec2 a2 = u_special.xz - u_special.yw; // sub\n\thighp vec2 a3 = u_special.xz * u_special.yw; // mul\n\thighp vec2 a4 = u_special.xz / u_special.yw; // div\n\thighp vec2 a5 = u_special.xz + u_special.yw * u_special.xz; // fma\n\n\thighp float green = 1.0 - abs((a1.y + a2.y + a3.y + a4.y + a5.y) - 6.0);\n\tv_out = vec4(a1.x*a3.x + a2.x*a4.x, green, a5.x, 1.0);\n\tgl_Position = a_pos;\n}\n"
    ;
    pcVar2 = "";
  }
  else {
    pcVar3 = "attribute highp vec4 a_pos;\nvoid main ()\n{\n\tgl_Position = a_pos;\n}\n";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string UniformCase::genVertexSource (void) const
{
	if (m_type == TYPE_VERTEX)
		return
			"attribute highp vec4 a_pos;\n"
			"uniform highp vec4 u_special;\n"
			"varying mediump vec4 v_out;\n"
			"void main ()\n"
			"{\n"
			"	highp vec2 a1 = u_special.xz + u_special.yw; // add\n"
			"	highp vec2 a2 = u_special.xz - u_special.yw; // sub\n"
			"	highp vec2 a3 = u_special.xz * u_special.yw; // mul\n"
			"	highp vec2 a4 = u_special.xz / u_special.yw; // div\n"
			"	highp vec2 a5 = u_special.xz + u_special.yw * u_special.xz; // fma\n"
			"\n"
			"	highp float green = 1.0 - abs((a1.y + a2.y + a3.y + a4.y + a5.y) - 6.0);\n"
			"	v_out = vec4(a1.x*a3.x + a2.x*a4.x, green, a5.x, 1.0);\n"
			"	gl_Position = a_pos;\n"
			"}\n";
	else
		return
			"attribute highp vec4 a_pos;\n"
			"void main ()\n"
			"{\n"
			"	gl_Position = a_pos;\n"
			"}\n";
}